

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O3

void __thiscall Response::Response(Response *this,Request *request,path *resolve_path)

{
  Status *this_00;
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Alloc_hider _Var2;
  size_type sVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  path filepath;
  path local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  string *local_2d0;
  string_type local_2c8;
  string *local_2a8;
  string *local_2a0;
  string local_298;
  string local_278;
  string local_258;
  undefined1 local_238 [32];
  uint local_218;
  
  local_2d8 = &(this->protocol).field_2;
  (this->protocol)._M_dataplus._M_p = (pointer)local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"HTTP/1.1","");
  local_2e0 = &(this->server).field_2;
  (this->server)._M_dataplus._M_p = (pointer)local_2e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->server,"Apache/2.2.8 (Ubuntu) mod_ssl/2.2.8 OpenSSL/0.9.8g","");
  local_2e8 = &(this->connection).field_2;
  (this->connection)._M_dataplus._M_p = (pointer)local_2e8;
  local_2a0 = &this->server;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->connection,"close","");
  this->content_length = 0;
  this_00 = &this->status;
  local_2a8 = &this->connection;
  Status::Status(this_00,200);
  get_date_abi_cxx11_();
  local_2d0 = (string *)&this->content_type;
  (this->content_type)._M_dataplus._M_p = (pointer)&(this->content_type).field_2;
  (this->content_type)._M_string_length = 0;
  (this->content_type).field_2._M_local_buf[0] = '\0';
  (this->body).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->body).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pcVar1 = (request->path)._M_dataplus._M_p;
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,pcVar1,pcVar1 + (request->path)._M_string_length);
  prepare_url(&local_310._M_pathname,this,&local_278);
  std::filesystem::__cxx11::path::path((path *)local_238,&local_310._M_pathname,auto_format);
  std::filesystem::__cxx11::path::operator+=(resolve_path,(path *)local_238);
  std::filesystem::__cxx11::path::~path((path *)local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_pathname._M_dataplus._M_p != &local_310._M_pathname.field_2) {
    operator_delete(local_310._M_pathname._M_dataplus._M_p,
                    local_310._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::path(&local_310,resolve_path);
  lVar6 = std::__cxx11::string::find((char *)&request->path,0x10963a,0);
  if (lVar6 == -1) {
    cVar4 = std::filesystem::status(&local_310);
    if ((cVar4 == -1) || (cVar4 == '\0')) {
      Status::Status((Status *)local_238,0x194);
    }
    else {
      cVar4 = std::filesystem::__cxx11::path::has_filename();
      if (cVar4 == '\0') {
        std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
                  ((path *)local_238,(char (*) [11])"index.html",auto_format);
        std::filesystem::__cxx11::path::replace_filename(&local_310);
        std::filesystem::__cxx11::path::~path((path *)local_238);
      }
      cVar4 = std::filesystem::status(&local_310);
      if ((cVar4 != -1) && (cVar4 != '\0')) {
        iVar5 = std::__cxx11::string::compare((char *)request);
        if (iVar5 != 0) {
          iVar5 = std::__cxx11::string::compare((char *)request);
          if (iVar5 != 0) {
            Status::Status((Status *)local_238,0x195);
            goto LAB_00107d90;
          }
        }
        sVar7 = std::filesystem::file_size(&local_310);
        this->content_length = sVar7;
        Status::Status((Status *)local_238,200);
        std::__cxx11::string::operator=((string *)this_00,(string *)local_238);
        (this->status).code = local_218;
        if ((Response *)local_238._0_8_ != (Response *)(local_238 + 0x10)) {
          operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
        }
        auVar8 = std::filesystem::__cxx11::path::_M_find_extension();
        if (auVar8._8_8_ == -1 || auVar8._0_8_ == 0) {
          std::filesystem::__cxx11::path::path((path *)local_238);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_2c8,auVar8._0_8_);
          std::filesystem::__cxx11::path::path((path *)local_238,&local_2c8,auto_format);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
        }
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_238._0_8_,(pointer)(local_238._0_8_ + local_238._8_8_)
                  );
        parse_mime(&local_258,(Response *)local_238._0_8_,&local_298);
        std::__cxx11::string::operator=(local_2d0,(string *)&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        std::filesystem::__cxx11::path::~path((path *)local_238);
        iVar5 = std::__cxx11::string::compare((char *)request);
        if (iVar5 == 0) {
          std::ifstream::ifstream(local_238,local_310._M_pathname._M_dataplus._M_p,_S_in);
          local_2c8._M_dataplus._M_p = (pointer)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<std::ifstream,std::allocator<std::ifstream>,std::ifstream>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2c8._M_string_length,
                     (basic_ifstream<char,_std::char_traits<char>_> **)&local_2c8,
                     (allocator<std::basic_ifstream<char,_std::char_traits<char>_>_> *)&local_258,
                     (basic_ifstream<char,_std::char_traits<char>_> *)local_238);
          sVar3 = local_2c8._M_string_length;
          _Var2._M_p = local_2c8._M_dataplus._M_p;
          local_2c8._M_dataplus._M_p = (pointer)0x0;
          local_2c8._M_string_length = 0;
          this_01 = (this->body).
                    super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (this->body).
          super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)_Var2._M_p;
          (this->body).
          super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._M_string_length)
              ;
            }
          }
          std::ifstream::~ifstream(local_238);
        }
        goto LAB_00107dcd;
      }
      Status::Status((Status *)local_238,0x193);
    }
  }
  else {
    Status::Status((Status *)local_238,0x193);
  }
LAB_00107d90:
  std::__cxx11::string::operator=((string *)this_00,(string *)local_238);
  (this->status).code = local_218;
  if ((Response *)local_238._0_8_ != (Response *)(local_238 + 0x10)) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
LAB_00107dcd:
  std::filesystem::__cxx11::path::~path(&local_310);
  return;
}

Assistant:

Response::Response(const Request& request, fs::path resolve_path) :
            protocol("HTTP/1.1"),
            server("Apache/2.2.8 (Ubuntu) mod_ssl/2.2.8 OpenSSL/0.9.8g"),
            connection("close"),
            content_length(0),
            date(get_date()),
            body(nullptr) {

    resolve_path += fs::path(prepare_url(request.path));
    fs::path filepath = resolve_path;

    if (request.path.find("../") != std::string::npos) {
        status = Response::Status(403);
        return;
    }
    if (!fs::exists(filepath)) {
        status = Response::Status(404);
        return;
    }

    if (!filepath.has_filename()) {
        filepath.replace_filename("index.html");
    } 
    if (!fs::exists(filepath)) {
        status = Response::Status(403);
        return;
    }

    if (request.method != "HEAD" && request.method != "GET") {
        status = Response::Status(405);
        return;
    }
    {   
        content_length = fs::file_size(filepath);
    }

    status = Response::Status(200);
    content_type = parse_mime(filepath.extension());
    if (request.method == "GET") {
        body = std::make_shared<std::ifstream>(std::ifstream(filepath));
        return;
    }
}